

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O2

void __thiscall re2::PrefilterTree::PrintDebugInfo(PrefilterTree *this,NodeMap *nodes)

{
  int iVar1;
  pointer pEVar2;
  int *piVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  int *piVar7;
  LogMessage local_1b0;
  
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
             ,0x161);
  poVar4 = std::operator<<((ostream *)&local_1b0.str_,"#Unique Atoms: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  LogMessage::~LogMessage(&local_1b0);
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
             ,0x162);
  poVar4 = std::operator<<((ostream *)&local_1b0.str_,"#Unique Nodes: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  LogMessage::~LogMessage(&local_1b0);
  uVar6 = 0;
  while( true ) {
    pEVar2 = (this->entries_).
             super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->entries_).
                       super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2) / 0x38) <= uVar6)
    break;
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
               ,0x167);
    poVar4 = std::operator<<((ostream *)&local_1b0.str_,"EntryId: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," N: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," R: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    LogMessage::~LogMessage(&local_1b0);
    piVar3 = *(pointer *)
              ((long)&pEVar2[uVar6].parents.super__Vector_base<int,_std::allocator<int>_> + 8);
    for (piVar7 = *(int **)&pEVar2[uVar6].parents.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl; piVar7 != piVar3; piVar7 = piVar7 + 1) {
      iVar1 = *piVar7;
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
                 ,0x16a);
      std::ostream::operator<<(&local_1b0.str_,iVar1);
      LogMessage::~LogMessage(&local_1b0);
    }
    uVar6 = uVar6 + 1;
  }
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
             ,0x16c);
  std::operator<<((ostream *)&local_1b0.str_,"Map:");
  LogMessage::~LogMessage(&local_1b0);
  for (p_Var5 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(nodes->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
               ,0x16f);
    poVar4 = std::operator<<((ostream *)&local_1b0.str_,"NodeId: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(*(long *)(p_Var5 + 2) + 0x30));
    poVar4 = std::operator<<(poVar4," Str: ");
    std::operator<<(poVar4,(string *)(p_Var5 + 1));
    LogMessage::~LogMessage(&local_1b0);
  }
  return;
}

Assistant:

void PrefilterTree::PrintDebugInfo(NodeMap* nodes) {
  LOG(ERROR) << "#Unique Atoms: " << atom_index_to_id_.size();
  LOG(ERROR) << "#Unique Nodes: " << entries_.size();

  for (size_t i = 0; i < entries_.size(); i++) {
    const std::vector<int>& parents = entries_[i].parents;
    const std::vector<int>& regexps = entries_[i].regexps;
    LOG(ERROR) << "EntryId: " << i
               << " N: " << parents.size() << " R: " << regexps.size();
    for (int parent : parents)
      LOG(ERROR) << parent;
  }
  LOG(ERROR) << "Map:";
  for (NodeMap::const_iterator iter = nodes->begin();
       iter != nodes->end(); ++iter)
    LOG(ERROR) << "NodeId: " << (*iter).second->unique_id()
               << " Str: " << (*iter).first;
}